

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O1

unsigned_long_long measure(string *what,function<unsigned_long_long_()> *cb)

{
  int iVar1;
  char *__nptr;
  ostream *poVar2;
  unsigned_long_long uVar3;
  int *piVar4;
  ulonglong uVar5;
  undefined8 uVar6;
  string *psVar7;
  long lVar8;
  unsigned_long_long uStack_58;
  char *pcStack_50;
  
  psVar7 = what;
  std::chrono::_V2::system_clock::now();
  if ((cb->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*cb->_M_invoker)((_Any_data *)cb);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(what->_M_dataplus)._M_p,what->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," took ",6);
    std::chrono::_V2::system_clock::now();
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ms",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    uVar3 = std::ostream::flush();
    return uVar3;
  }
  std::__throw_bad_function_call();
  uStack_58 = 0;
  lVar8 = 500000000;
  piVar4 = __errno_location();
  while( true ) {
    __nptr = *(char **)psVar7->_M_string_length;
    iVar1 = *piVar4;
    *piVar4 = 0;
    uVar5 = strtoull(__nptr,&pcStack_50,10);
    if (pcStack_50 == __nptr) break;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) goto LAB_00105a74;
    uStack_58 = uStack_58 + uVar5;
    lVar8 = lVar8 + -1;
    if (lVar8 == 0) {
      return uStack_58;
    }
  }
  std::__throw_invalid_argument("stoull");
LAB_00105a74:
  uVar6 = std::__throw_out_of_range("stoull");
  if (*piVar4 == 0) {
    *piVar4 = iVar1;
  }
  _Unwind_Resume(uVar6);
}

Assistant:

static unsigned long long measure(std::string const& what, std::function<unsigned long long()> const& cb) {
  typedef std::chrono::high_resolution_clock clock;
  std::chrono::time_point<clock> start = clock::now();

  unsigned long long result = cb();

  std::cout << what << " took "
            << std::chrono::duration_cast<std::chrono::milliseconds>(clock::now() - start).count() << " ms" 
            << std::endl;

  return result;
}